

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O0

void __thiscall ScopedTempDir::CreateAndEnter(ScopedTempDir *this,string *name)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  int *piVar4;
  char *tempname;
  char name_template [1024];
  string *name_local;
  ScopedTempDir *this_local;
  
  (anonymous_namespace)::GetSystemTempDir_abi_cxx11_();
  std::__cxx11::string::operator=((string *)this,(string *)(name_template + 0x3f8));
  std::__cxx11::string::~string((string *)(name_template + 0x3f8));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    Fatal("couldn\'t get system temp dir");
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = chdir(pcVar3);
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    Fatal("chdir: %s",pcVar3);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)&tempname,pcVar3);
  strcat((char *)&tempname,"-XXXXXX");
  pcVar3 = mkdtemp((char *)&tempname);
  if (pcVar3 == (char *)0x0) {
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    Fatal("mkdtemp: %s",pcVar3);
  }
  std::__cxx11::string::operator=((string *)&this->temp_dir_name_,pcVar3);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = chdir(pcVar3);
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    Fatal("chdir: %s",pcVar3);
  }
  return;
}

Assistant:

void ScopedTempDir::CreateAndEnter(const string& name) {
  // First change into the system temp dir and save it for cleanup.
  start_dir_ = GetSystemTempDir();
  if (start_dir_.empty())
    Fatal("couldn't get system temp dir");
  if (chdir(start_dir_.c_str()) < 0)
    Fatal("chdir: %s", strerror(errno));

  // Create a temporary subdirectory of that.
  char name_template[1024];
  strcpy(name_template, name.c_str());
  strcat(name_template, "-XXXXXX");
  char* tempname = mkdtemp(name_template);
  if (!tempname)
    Fatal("mkdtemp: %s", strerror(errno));
  temp_dir_name_ = tempname;

  // chdir into the new temporary directory.
  if (chdir(temp_dir_name_.c_str()) < 0)
    Fatal("chdir: %s", strerror(errno));
}